

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void ReportOnFunctionSelectError
               (ExpressionContext *ctx,SynBase *source,char *errorBuf,uint errorBufSize,
               char *messageStart,ArrayView<FunctionValue> functions)

{
  InplaceStr functionName;
  IntrusiveList<TypeHandle> generics_00;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<unsigned_int> ratings_00;
  InplaceStr local_88;
  undefined1 local_78 [8];
  ArrayView<unsigned_int> ratings;
  ArrayView<ArgumentData> arguments;
  IntrusiveList<TypeHandle> generics;
  char *messageStart_local;
  uint errorBufSize_local;
  char *errorBuf_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  IntrusiveList<TypeHandle>::IntrusiveList((IntrusiveList<TypeHandle> *)&arguments.count);
  ArrayView<ArgumentData>::ArrayView((ArrayView<ArgumentData> *)&ratings.count);
  ArrayView<unsigned_int>::ArrayView((ArrayView<unsigned_int> *)local_78);
  InplaceStr::InplaceStr(&local_88);
  functionName.end = local_88.end;
  functionName.begin = local_88.begin;
  generics_00.tail = generics.head;
  generics_00.head = (TypeHandle *)arguments._8_8_;
  arguments_00._8_8_ = arguments.data;
  arguments_00.data = (ArgumentData *)ratings._8_8_;
  ratings_00._8_8_ = ratings.data;
  ratings_00.data = (uint *)local_78;
  ReportOnFunctionSelectError
            (ctx,source,errorBuf,errorBufSize,messageStart,functionName,functions,generics_00,
             arguments_00,ratings_00,0,false);
  return;
}

Assistant:

void ReportOnFunctionSelectError(ExpressionContext &ctx, SynBase *source, char* errorBuf, unsigned errorBufSize, const char *messageStart, ArrayView<FunctionValue> functions)
{
	IntrusiveList<TypeHandle> generics;
	ArrayView<ArgumentData> arguments;
	ArrayView<unsigned> ratings;

	ReportOnFunctionSelectError(ctx, source, errorBuf, errorBufSize, messageStart, InplaceStr(), functions, generics, arguments, ratings, 0, false);
}